

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::ValueFederate(ValueFederate *this,void **vtt,string *configString)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  void **in_stack_ffffffffffffffa8;
  ValueFederate *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffb8;
  std::__cxx11::string::string(in_RSI);
  std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  ValueFederate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8,
                (string *)in_RSI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  return;
}

Assistant:

ValueFederate::ValueFederate(const std::string& configString):
    ValueFederate(std::string{}, configString)
{
}